

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilut.h
# Opt level: O0

int Mini_LutCreatePo(Mini_Lut_t *p,int Var0)

{
  int local_14;
  Mini_Lut_t *pMStack_10;
  int Var0_local;
  Mini_Lut_t *p_local;
  
  local_14 = Var0;
  pMStack_10 = p;
  if ((-1 < Var0) && (Var0 < p->nSize)) {
    Mini_LutPush(p,1,&local_14,(uint *)0x0);
    pMStack_10->pArray[pMStack_10->LutSize * (pMStack_10->nSize + -1) + 1] = 0x7ffffffe;
    return pMStack_10->nSize + -1;
  }
  __assert_fail("Var0 >= 0 && Var0 < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/minilut.h"
                ,0xed,"int Mini_LutCreatePo(Mini_Lut_t *, int)");
}

Assistant:

static int Mini_LutCreatePo( Mini_Lut_t * p, int Var0 )
{
    assert( Var0 >= 0 && Var0 < p->nSize );
    Mini_LutPush( p, 1, &Var0, NULL );
    // mark PO by setting its 2nd fanin to the special number
    p->pArray[p->LutSize*(p->nSize - 1)+1] = MINI_LUT_NULL2;
    return p->nSize - 1;
}